

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

void __thiscall
duckdb::Serializer::WriteValue<duckdb::BlockPointer>
          (Serializer *this,vector<duckdb::BlockPointer,_true> *vec)

{
  pointer pBVar1;
  BlockPointer *item;
  pointer value;
  
  (*this->_vptr_Serializer[8])
            (this,(long)(vec->
                        super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
                        super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(vec->
                        super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
                        super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4);
  pBVar1 = (vec->super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
           super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (value = (vec->super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
               super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
               _M_impl.super__Vector_impl_data._M_start; value != pBVar1; value = value + 1) {
    WriteValue<duckdb::BlockPointer>(this,value);
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}